

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.hpp
# Opt level: O0

IDeviceObject * __thiscall
Diligent::ShaderVariableManagerGL::ImageBindInfo::Get(ImageBindInfo *this,Uint32 ArrayIndex)

{
  ShaderResourceCacheGL *this_00;
  Char *Message;
  ResourceAttribs *pRVar1;
  CachedResourceView *this_01;
  IDeviceObject *pIVar2;
  CachedResourceView *Img;
  undefined1 local_40 [8];
  string msg;
  PipelineResourceDesc *Desc;
  Uint32 ArrayIndex_local;
  ImageBindInfo *this_local;
  
  msg.field_2._8_8_ =
       ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
       ::GetDesc((ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                  *)this);
  if (((PipelineResourceDesc *)msg.field_2._8_8_)->ArraySize <= ArrayIndex) {
    FormatString<char[26],char[28]>
              ((string *)local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ArrayIndex < Desc.ArraySize",(char (*) [28])msg.field_2._8_8_);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"Get",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderVariableManagerGL.hpp"
               ,0xa8);
    std::__cxx11::string::~string((string *)local_40);
  }
  this_00 = (((this->super_GLVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo>).
              super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
             .m_ParentManager)->super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>)
            .m_ResourceCache;
  pRVar1 = GLVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo>::GetAttribs
                     (&this->super_GLVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo>)
  ;
  this_01 = ShaderResourceCacheGL::GetConstImage(this_00,pRVar1->CacheOffset + ArrayIndex);
  pIVar2 = Diligent::RefCntAutoPtr::operator_cast_to_IDeviceObject_((RefCntAutoPtr *)this_01);
  return pIVar2;
}

Assistant:

Get(Uint32 ArrayIndex) const override final
        {
            const auto& Desc = GetDesc();
            VERIFY_EXPR(ArrayIndex < Desc.ArraySize);
            const auto& Img = m_ParentManager.m_ResourceCache.GetConstImage(GetAttribs().CacheOffset + ArrayIndex);
            return Img.pView;
        }